

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLCONVOLUTIONPARAMETERFVPROC epoxy_glConvolutionParameterfv_resolver(void)

{
  PFNGLCONVOLUTIONPARAMETERFVPROC p_Var1;
  
  p_Var1 = (PFNGLCONVOLUTIONPARAMETERFVPROC)
           gl_provider_resolver
                     ("glConvolutionParameterfv",epoxy_glConvolutionParameterfv_resolver::providers,
                      epoxy_glConvolutionParameterfv_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLCONVOLUTIONPARAMETERFVPROC
epoxy_glConvolutionParameterfv_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_ARB_imaging,
        GL_extension_GL_EXT_convolution,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        6686 /* "glConvolutionParameterfv" */,
        6711 /* "glConvolutionParameterfvEXT" */,
    };
    return gl_provider_resolver(entrypoint_strings + 6686 /* "glConvolutionParameterfv" */,
                                providers, entrypoints);
}